

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

double xmlXPathStringEvalNumber(xmlChar *str)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  bool bVar5;
  bool bVar6;
  double dVar7;
  undefined1 auVar8 [16];
  double local_60;
  double fraction;
  int local_50;
  int max;
  int frac;
  int v;
  double temp;
  unsigned_long tmp;
  int is_exponent_negative;
  int exponent;
  int isneg;
  int ok;
  double ret;
  xmlChar *cur;
  xmlChar *str_local;
  
  bVar6 = false;
  tmp._4_4_ = 0;
  bVar2 = false;
  ret = (double)str;
  if (str == (xmlChar *)0x0) {
    str_local = (xmlChar *)0x0;
  }
  else {
    while( true ) {
      bVar5 = true;
      if ((*(char *)ret != ' ') && ((*(byte *)ret < 9 || (bVar5 = true, 10 < *(byte *)ret)))) {
        bVar5 = *(char *)ret == '\r';
      }
      if (!bVar5) break;
      ret = (double)((long)ret + 1);
    }
    cVar1 = *(char *)ret;
    if (cVar1 == '-') {
      ret = (double)((long)ret + 1);
    }
    if ((*(char *)ret == '.') || ((0x2f < *(byte *)ret && (*(byte *)ret < 0x3a)))) {
      _isneg = 0.0;
      while( true ) {
        bVar5 = false;
        if (0x2f < *(byte *)ret) {
          bVar5 = *(byte *)ret < 0x3a;
        }
        if (!bVar5) break;
        iVar3 = *(byte *)ret - 0x30;
        bVar6 = true;
        ret = (double)((long)ret + 1);
        auVar8._8_4_ = iVar3 >> 0x1f;
        auVar8._0_8_ = (long)iVar3;
        auVar8._12_4_ = 0x45300000;
        _isneg = _isneg * 10.0 +
                 (auVar8._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,iVar3) - 4503599627370496.0);
      }
      if (*(char *)ret == '.') {
        local_50 = 0;
        local_60 = 0.0;
        ret = (double)((long)ret + 1);
        if (((*(byte *)ret < 0x30) || (0x39 < *(byte *)ret)) && (!bVar6)) {
          return xmlXPathNAN;
        }
        for (; *(char *)ret == '0'; ret = (double)((long)ret + 1)) {
          local_50 = local_50 + 1;
        }
        iVar3 = local_50 + 0x14;
        while( true ) {
          bVar6 = false;
          if ((0x2f < *(byte *)ret) && (bVar6 = false, *(byte *)ret < 0x3a)) {
            bVar6 = local_50 < iVar3;
          }
          if (!bVar6) break;
          local_60 = local_60 * 10.0 + (double)(int)(*(byte *)ret - 0x30);
          local_50 = local_50 + 1;
          ret = (double)((long)ret + 1);
        }
        dVar7 = pow(10.0,(double)local_50);
        _isneg = _isneg + local_60 / dVar7;
        while( true ) {
          bVar6 = false;
          if (0x2f < *(byte *)ret) {
            bVar6 = *(byte *)ret < 0x3a;
          }
          if (!bVar6) break;
          ret = (double)((long)ret + 1);
        }
      }
      if ((*(char *)ret == 'e') || (*(char *)ret == 'E')) {
        pcVar4 = (char *)((long)ret + 1);
        if (*pcVar4 == '-') {
          bVar2 = true;
          pcVar4 = (char *)((long)ret + 2);
        }
        else if (*pcVar4 == '+') {
          pcVar4 = (char *)((long)ret + 2);
        }
        while( true ) {
          ret = (double)pcVar4;
          bVar6 = false;
          if (0x2f < *(byte *)ret) {
            bVar6 = *(byte *)ret < 0x3a;
          }
          if (!bVar6) break;
          if (tmp._4_4_ < 1000000) {
            tmp._4_4_ = tmp._4_4_ * 10 + (*(byte *)ret - 0x30);
          }
          pcVar4 = (char *)((long)ret + 1);
        }
      }
      while( true ) {
        bVar6 = true;
        if ((*(char *)ret != ' ') && ((*(byte *)ret < 9 || (bVar6 = true, 10 < *(byte *)ret)))) {
          bVar6 = *(char *)ret == '\r';
        }
        if (!bVar6) break;
        ret = (double)((long)ret + 1);
      }
      if (*(char *)ret == '\0') {
        if (cVar1 == '-') {
          _isneg = -_isneg;
        }
        if (bVar2) {
          tmp._4_4_ = -tmp._4_4_;
        }
        dVar7 = pow(10.0,(double)tmp._4_4_);
        str_local = (xmlChar *)(dVar7 * _isneg);
      }
      else {
        str_local = (xmlChar *)xmlXPathNAN;
      }
    }
    else {
      str_local = (xmlChar *)xmlXPathNAN;
    }
  }
  return (double)str_local;
}

Assistant:

double
xmlXPathStringEvalNumber(const xmlChar *str) {
    const xmlChar *cur = str;
    double ret;
    int ok = 0;
    int isneg = 0;
    int exponent = 0;
    int is_exponent_negative = 0;
#ifdef __GNUC__
    unsigned long tmp = 0;
    double temp;
#endif
    if (cur == NULL) return(0);
    while (IS_BLANK_CH(*cur)) cur++;
    if (*cur == '-') {
	isneg = 1;
	cur++;
    }
    if ((*cur != '.') && ((*cur < '0') || (*cur > '9'))) {
        return(xmlXPathNAN);
    }

#ifdef __GNUC__
    /*
     * tmp/temp is a workaround against a gcc compiler bug
     * http://veillard.com/gcc.bug
     */
    ret = 0;
    while ((*cur >= '0') && (*cur <= '9')) {
	ret = ret * 10;
	tmp = (*cur - '0');
	ok = 1;
	cur++;
	temp = (double) tmp;
	ret = ret + temp;
    }
#else
    ret = 0;
    while ((*cur >= '0') && (*cur <= '9')) {
	ret = ret * 10 + (*cur - '0');
	ok = 1;
	cur++;
    }
#endif

    if (*cur == '.') {
	int v, frac = 0, max;
	double fraction = 0;

        cur++;
	if (((*cur < '0') || (*cur > '9')) && (!ok)) {
	    return(xmlXPathNAN);
	}
        while (*cur == '0') {
	    frac = frac + 1;
	    cur++;
        }
        max = frac + MAX_FRAC;
	while (((*cur >= '0') && (*cur <= '9')) && (frac < max)) {
	    v = (*cur - '0');
	    fraction = fraction * 10 + v;
	    frac = frac + 1;
	    cur++;
	}
	fraction /= pow(10.0, frac);
	ret = ret + fraction;
	while ((*cur >= '0') && (*cur <= '9'))
	    cur++;
    }
    if ((*cur == 'e') || (*cur == 'E')) {
      cur++;
      if (*cur == '-') {
	is_exponent_negative = 1;
	cur++;
      } else if (*cur == '+') {
        cur++;
      }
      while ((*cur >= '0') && (*cur <= '9')) {
        if (exponent < 1000000)
	  exponent = exponent * 10 + (*cur - '0');
	cur++;
      }
    }
    while (IS_BLANK_CH(*cur)) cur++;
    if (*cur != 0) return(xmlXPathNAN);
    if (isneg) ret = -ret;
    if (is_exponent_negative) exponent = -exponent;
    ret *= pow(10.0, (double)exponent);
    return(ret);
}